

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocale::name(QString *__return_storage_ptr__,QLocale *this,TagSeparator separator)

{
  QLocalePrivate *this_00;
  QLocaleData *pQVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1String local_60;
  QStringBuilder<QStringBuilder<QLatin1String_&,_QLatin1Char>,_QLatin1String> local_50;
  _Type local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)separator < '\0') {
    badSeparatorWarning("name",separator);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_002d8830;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_2c = (_Type)QLocalePrivate::languageCode((this->d).d.ptr,(LanguageCodeTypes)0xffffffff);
    local_60.m_size = QtPrivate::lengthHelperPointer<char>(local_2c);
    this_00 = (this->d).d.ptr;
    pQVar1 = this_00->m_data;
    local_60.m_data = local_2c;
    if ((pQVar1->m_language_id == 1) || (pQVar1->m_territory_id == 0)) {
      latin1.m_data = local_2c;
      latin1.m_size = local_60.m_size;
      QString::QString(__return_storage_ptr__,latin1);
    }
    else {
      local_50.b = QLocalePrivate::territoryCode(this_00);
      local_50.a.a = &local_60;
      local_50.a.b.ch = separator;
      QStringBuilder<QStringBuilder<QLatin1String_&,_QLatin1Char>,_QLatin1String>::
      convertTo<QString>(__return_storage_ptr__,&local_50);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_002d8830:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::name(TagSeparator separator) const
{
    const char sep = char(separator);
    if (uchar(sep) > 0x7f) {
        badSeparatorWarning("name", sep);
        return {};
    }
    const auto code = d->languageCode();
    QLatin1StringView view{code.data()};

    Language l = language();
    if (l == C)
        return view;

    Territory c = territory();
    if (c == AnyTerritory)
        return view;

    return view + QLatin1Char(sep) + d->territoryCode();
}